

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

void metacall_constructor(void)

{
  int iVar1;
  char *pcVar2;
  void *v;
  void **ppvVar3;
  void *pvVar4;
  metacall_initialize_configuration_type local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (metacall_initialize_flag == '\0') {
    pcVar2 = environment_variable_get("METACALL_HOST",(char *)0x0);
    portability_atexit_initialize();
    if (pcVar2 != (char *)0x0) {
      local_38.tag = pcVar2;
      v = metacall_value_create_map((void **)0x0,1);
      local_28 = 0;
      uStack_20 = 0;
      local_38.options = v;
      ppvVar3 = metacall_value_to_map(v);
      pvVar4 = metacall_value_create_array((void **)0x0,2);
      *ppvVar3 = pvVar4;
      ppvVar3 = metacall_value_to_array(pvVar4);
      pvVar4 = metacall_value_create_string("host",4);
      *ppvVar3 = pvVar4;
      pvVar4 = metacall_value_create_bool('\x01');
      ppvVar3[1] = pvVar4;
      iVar1 = metacall_initialize_ex(&local_38);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x72,"metacall_constructor",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,"MetaCall host constructor failed to initialize");
        metacall_value_destroy(v);
        exit(1);
      }
      portability_atexit_register(metacall_destroy);
    }
  }
  return;
}

Assistant:

portability_constructor(metacall_constructor)
{
	if (metacall_initialize_flag == 1)
	{
		const char *metacall_host = environment_variable_get("METACALL_HOST", NULL);

		/* Initialize at exit handlers */
		portability_atexit_initialize();

		/* We are running from a different host, initialize the loader of the host
		* and redirect it to the existing symbols, also avoiding initialization
		* and destruction of the runtime as it is being managed externally to MetaCall */
		if (metacall_host != NULL)
		{
			static const char host_str[] = "host";

			struct metacall_initialize_configuration_type config[] = {
				{ metacall_host, metacall_value_create_map(NULL, 1) },
				{ NULL, NULL }
			};

			/* Initialize the loader options with a map defining its options to { "host": true } */
			void **host_tuple, **options_map = metacall_value_to_map(config[0].options);

			options_map[0] = metacall_value_create_array(NULL, 2);

			host_tuple = metacall_value_to_array(options_map[0]);

			host_tuple[0] = metacall_value_create_string(host_str, sizeof(host_str) - 1);
			host_tuple[1] = metacall_value_create_bool(1);

			/* Initialize MetaCall with extra options, defining the host properly */
			if (metacall_initialize_ex(config) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "MetaCall host constructor failed to initialize");
				metacall_value_destroy(config[0].options);
				exit(1);
			}

			/* Register the destructor on exit */
			portability_atexit_register(metacall_destroy);
		}
	}
}